

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int onig_is_code_in_cc_len(int elen,OnigCodePoint code,void *cc_arg)

{
  int iVar1;
  CClassNode *cc;
  int found;
  void *cc_arg_local;
  OnigCodePoint code_local;
  int elen_local;
  
  if ((elen < 2) && (code < 0x100)) {
    cc._4_4_ = (uint)((*(uint *)((long)cc_arg + (ulong)(code >> 5) * 4 + 0x14) &
                      1 << ((byte)code & 0x1f)) != 0);
  }
  else if (*(long *)((long)cc_arg + 0x38) == 0) {
    cc._4_4_ = 0;
  }
  else {
    iVar1 = onig_is_in_code_range((OnigUChar *)**(undefined8 **)((long)cc_arg + 0x38),code);
    cc._4_4_ = (uint)(iVar1 != 0);
  }
  if ((*(uint *)((long)cc_arg + 0x10) & 1) == 0) {
    code_local = cc._4_4_;
  }
  else {
    code_local = (OnigCodePoint)((cc._4_4_ != 0 ^ 0xffU) & 1);
  }
  return code_local;
}

Assistant:

extern int
onig_is_code_in_cc_len(int elen, OnigCodePoint code, /* CClassNode* */ void* cc_arg)
{
  int found;
  CClassNode* cc = (CClassNode* )cc_arg;

  if (elen > 1 || (code >= SINGLE_BYTE_SIZE)) {
    if (IS_NULL(cc->mbuf)) {
      found = 0;
    }
    else {
      found = onig_is_in_code_range(cc->mbuf->p, code) != 0;
    }
  }
  else {
    found = BITSET_AT(cc->bs, code) != 0;
  }

  if (IS_NCCLASS_NOT(cc))
    return !found;
  else
    return found;
}